

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O0

void h_predictor_16x8(uint16_t *dst,ptrdiff_t stride,uint16_t *left)

{
  undefined1 (*in_RDX) [16];
  ptrdiff_t in_RSI;
  __m128i row7;
  __m128i row6;
  __m128i row5;
  __m128i row4;
  __m128i row3;
  __m128i row2;
  __m128i row1;
  __m128i row0;
  __m128i left_u16;
  __m128i local_b8;
  __m128i local_a8;
  __m128i local_98;
  __m128i local_88;
  __m128i local_78;
  __m128i local_68;
  __m128i local_58;
  __m128i local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  ptrdiff_t local_18;
  uint16_t *local_10 [2];
  
  local_38 = *(undefined8 *)*in_RDX;
  uStack_30 = *(undefined8 *)(*in_RDX + 8);
  local_48 = (__m128i)pshuflw(*in_RDX,*in_RDX,0);
  local_58 = (__m128i)pshuflw(*in_RDX,*in_RDX,0x55);
  local_68 = (__m128i)pshuflw(*in_RDX,*in_RDX,0xaa);
  local_78 = (__m128i)pshuflw(*in_RDX,*in_RDX,0xff);
  local_88 = (__m128i)pshufhw(*in_RDX,*in_RDX,0);
  local_98 = (__m128i)pshufhw(*in_RDX,*in_RDX,0x55);
  local_a8 = (__m128i)pshufhw(*in_RDX,*in_RDX,0xaa);
  local_b8 = (__m128i)pshufhw(*in_RDX,*in_RDX,0xff);
  local_18 = in_RSI;
  h_store_16_unpacklo(local_10,in_RSI,&local_48);
  h_store_16_unpacklo(local_10,local_18,&local_58);
  h_store_16_unpacklo(local_10,local_18,&local_68);
  h_store_16_unpacklo(local_10,local_18,&local_78);
  h_store_16_unpackhi(local_10,local_18,&local_88);
  h_store_16_unpackhi(local_10,local_18,&local_98);
  h_store_16_unpackhi(local_10,local_18,&local_a8);
  h_store_16_unpackhi(local_10,local_18,&local_b8);
  return;
}

Assistant:

static inline void h_predictor_16x8(uint16_t *dst, ptrdiff_t stride,
                                    const uint16_t *left) {
  const __m128i left_u16 = _mm_load_si128((const __m128i *)left);
  const __m128i row0 = _mm_shufflelo_epi16(left_u16, 0x0);
  const __m128i row1 = _mm_shufflelo_epi16(left_u16, 0x55);
  const __m128i row2 = _mm_shufflelo_epi16(left_u16, 0xaa);
  const __m128i row3 = _mm_shufflelo_epi16(left_u16, 0xff);
  const __m128i row4 = _mm_shufflehi_epi16(left_u16, 0x0);
  const __m128i row5 = _mm_shufflehi_epi16(left_u16, 0x55);
  const __m128i row6 = _mm_shufflehi_epi16(left_u16, 0xaa);
  const __m128i row7 = _mm_shufflehi_epi16(left_u16, 0xff);
  h_store_16_unpacklo(&dst, stride, &row0);
  h_store_16_unpacklo(&dst, stride, &row1);
  h_store_16_unpacklo(&dst, stride, &row2);
  h_store_16_unpacklo(&dst, stride, &row3);
  h_store_16_unpackhi(&dst, stride, &row4);
  h_store_16_unpackhi(&dst, stride, &row5);
  h_store_16_unpackhi(&dst, stride, &row6);
  h_store_16_unpackhi(&dst, stride, &row7);
}